

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::anon_unknown_0::GlobalLogSinkSet::AddLogSink
          (GlobalLogSinkSet *this,LogSink *sink)

{
  bool bVar1;
  int local_68 [2];
  char *local_60;
  char *absl_raw_log_internal_filename;
  __normal_iterator<absl::lts_20250127::LogSink_**,_std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
  local_50 [3];
  LogSink **local_38;
  __normal_iterator<absl::lts_20250127::LogSink_**,_std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
  local_30;
  __normal_iterator<absl::lts_20250127::LogSink_**,_std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
  local_28;
  __normal_iterator<absl::lts_20250127::LogSink_**,_std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
  pos;
  WriterMutexLock global_sinks_lock;
  LogSink *sink_local;
  GlobalLogSinkSet *this_local;
  
  global_sinks_lock.mu_ = (Mutex *)sink;
  WriterMutexLock::WriterMutexLock((WriterMutexLock *)&pos,&this->guard_);
  local_30._M_current =
       (LogSink **)
       std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>::
       begin(&this->sinks_);
  local_38 = (LogSink **)
             std::
             vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>::
             end(&this->sinks_);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<absl::lts_20250127::LogSink**,std::vector<absl::lts_20250127::LogSink*,std::allocator<absl::lts_20250127::LogSink*>>>,absl::lts_20250127::LogSink*>
                       (local_30,(__normal_iterator<absl::lts_20250127::LogSink_**,_std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
                                  )local_38,(LogSink **)&global_sinks_lock);
  local_50[0]._M_current =
       (LogSink **)
       std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>::
       end(&this->sinks_);
  bVar1 = __gnu_cxx::operator==(&local_28,local_50);
  if (bVar1) {
    std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>::
    push_back(&this->sinks_,(value_type *)&global_sinks_lock);
  }
  absl_raw_log_internal_filename._4_4_ = (uint)bVar1;
  WriterMutexLock::~WriterMutexLock((WriterMutexLock *)&pos);
  if (absl_raw_log_internal_filename._4_4_ == 0) {
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/log/internal/log_sink_set.cc"
    ;
    local_68[1] = 3;
    local_68[0] = 0xd7;
    base_internal::
    AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
    ::operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
                  *)raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_68 + 1)
                 ,&local_60,local_68,(char (*) [38])"Duplicate log sinks are not supported");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/log/internal/log_sink_set.cc"
                  ,0xd7,
                  "void absl::log_internal::(anonymous namespace)::GlobalLogSinkSet::AddLogSink(absl::LogSink *)"
                 );
  }
  return;
}

Assistant:

ABSL_LOCKS_EXCLUDED(guard_) {
    {
      absl::WriterMutexLock global_sinks_lock(&guard_);
      auto pos = std::find(sinks_.begin(), sinks_.end(), sink);
      if (pos == sinks_.end()) {
        sinks_.push_back(sink);
        return;
      }
    }
    ABSL_INTERNAL_LOG(FATAL, "Duplicate log sinks are not supported");
  }